

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

UBool ucnv_io_cleanup(void)

{
  if (gAliasData != (UDataMemory *)0x0) {
    udata_close_63(gAliasData);
    gAliasData = (UDataMemory *)0x0;
  }
  LOCK();
  gAliasDataInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  gMainTable.optionTableSize = 0;
  gMainTable.stringTableSize = 0;
  gMainTable.normalizedStringTableSize = 0;
  gMainTable._108_4_ = 0;
  gMainTable.aliasListSize = 0;
  gMainTable.untaggedConvArraySize = 0;
  gMainTable.taggedAliasArraySize = 0;
  gMainTable.taggedAliasListsSize = 0;
  gMainTable.normalizedStringTable = (uint16_t *)0x0;
  gMainTable.converterListSize = 0;
  gMainTable.tagListSize = 0;
  gMainTable.optionTable = (UConverterAliasOptions *)0x0;
  gMainTable.stringTable = (uint16_t *)0x0;
  gMainTable.taggedAliasArray = (uint16_t *)0x0;
  gMainTable.taggedAliasLists = (uint16_t *)0x0;
  gMainTable.aliasList = (uint16_t *)0x0;
  gMainTable.untaggedConvArray = (uint16_t *)0x0;
  gMainTable.converterList = (uint16_t *)0x0;
  gMainTable.tagList = (uint16_t *)0x0;
  return '\x01';
}

Assistant:

static UBool U_CALLCONV ucnv_io_cleanup(void)
{
    if (gAliasData) {
        udata_close(gAliasData);
        gAliasData = NULL;
    }
    gAliasDataInitOnce.reset();

    uprv_memset(&gMainTable, 0, sizeof(gMainTable));

    return TRUE;                   /* Everything was cleaned up */
}